

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# possible_match_test.cc
# Opt level: O0

void re2::PossibleMatchRangeHandWritten(void)

{
  Prog *pPVar1;
  bool bVar2;
  undefined8 *puVar3;
  ostream *poVar4;
  long lVar5;
  LogMessage local_c18;
  LogMessage local_a98;
  LogMessage local_918;
  RE2 local_798;
  LogMessage local_6b8;
  LogMessage local_538;
  Prog *local_3b8;
  Prog *prog;
  StringPiece local_230;
  Regexp *local_220;
  Regexp *re;
  re2 local_208 [48];
  LogMessage local_1d8;
  string local_58 [8];
  string max;
  string local_38 [8];
  string min;
  PrefixTest *t;
  int j;
  int i;
  
  for (t._4_4_ = 0; t._4_4_ < 0x43; t._4_4_ = t._4_4_ + 1) {
    for (t._0_4_ = 0; (int)t < 2; t._0_4_ = (int)t + 1) {
      lVar5 = (long)t._4_4_ * 0x20;
      puVar3 = (undefined8 *)(tests + lVar5);
      std::__cxx11::string::string(local_38);
      std::__cxx11::string::string(local_58);
      if ((int)t == 0) {
        LogMessage::LogMessage
                  (&local_1d8,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/possible_match_test.cc"
                   ,0x6e,0);
        poVar4 = LogMessage::stream(&local_1d8);
        poVar4 = std::operator<<(poVar4,"Checking regexp=");
        StringPiece::StringPiece((StringPiece *)&re,(char *)*puVar3);
        CEscape_abi_cxx11_(local_208,(StringPiece *)&re);
        std::operator<<(poVar4,(string *)local_208);
        std::__cxx11::string::~string((string *)local_208);
        LogMessage::~LogMessage(&local_1d8);
        StringPiece::StringPiece(&local_230,(char *)*puVar3);
        local_220 = Regexp::Parse(&local_230,LikePerl,(RegexpStatus *)0x0);
        if (local_220 == (Regexp *)0x0) {
          LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&prog,
                     "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/possible_match_test.cc"
                     ,0x70);
          poVar4 = LogMessage::stream((LogMessage *)&prog);
          std::operator<<(poVar4,"Check failed: re");
          LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&prog);
        }
        local_3b8 = Regexp::CompileToProg(local_220,0);
        if (local_3b8 == (Prog *)0x0) {
          LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_538,
                     "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/possible_match_test.cc"
                     ,0x72);
          poVar4 = LogMessage::stream(&local_538);
          std::operator<<(poVar4,"Check failed: prog");
          LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_538);
        }
        bVar2 = Prog::PossibleMatchRange
                          (local_3b8,(string *)local_38,(string *)local_58,
                           *(int *)(tests + lVar5 + 8));
        if (!bVar2) {
          LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_6b8,
                     "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/possible_match_test.cc"
                     ,0x73);
          poVar4 = LogMessage::stream(&local_6b8);
          poVar4 = std::operator<<(poVar4,
                                   "Check failed: prog->PossibleMatchRange(&min, &max, t.maxlen)");
          poVar4 = std::operator<<(poVar4," ");
          std::operator<<(poVar4,(char *)*puVar3);
          LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_6b8);
        }
        pPVar1 = local_3b8;
        if (local_3b8 != (Prog *)0x0) {
          Prog::~Prog(local_3b8);
          operator_delete(pPVar1);
        }
        Regexp::Decref(local_220);
      }
      else {
        RE2::RE2(&local_798,(char *)*puVar3);
        bVar2 = RE2::PossibleMatchRange
                          (&local_798,(string *)local_38,(string *)local_58,
                           *(int *)(tests + lVar5 + 8));
        RE2::~RE2(&local_798);
        if (!bVar2) {
          LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_918,
                     "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/possible_match_test.cc"
                     ,0x78);
          poVar4 = LogMessage::stream(&local_918);
          std::operator<<(poVar4,
                          "Check failed: RE2(t.regexp).PossibleMatchRange(&min, &max, t.maxlen)");
          LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_918);
        }
      }
      bVar2 = std::operator==(*(char **)(tests + lVar5 + 0x10),
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_38);
      if (!bVar2) {
        LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_a98,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/possible_match_test.cc"
                   ,0x7a);
        poVar4 = LogMessage::stream(&local_a98);
        poVar4 = std::operator<<(poVar4,"Check failed: (t.min) == (min)");
        std::operator<<(poVar4,(char *)*puVar3);
        LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_a98);
      }
      bVar2 = std::operator==(*(char **)(tests + lVar5 + 0x18),
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_58);
      if (!bVar2) {
        LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_c18,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/possible_match_test.cc"
                   ,0x7b);
        poVar4 = LogMessage::stream(&local_c18);
        poVar4 = std::operator<<(poVar4,"Check failed: (t.max) == (max)");
        std::operator<<(poVar4,(char *)*puVar3);
        LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_c18);
      }
      std::__cxx11::string::~string(local_58);
      std::__cxx11::string::~string(local_38);
    }
  }
  return;
}

Assistant:

TEST(PossibleMatchRange, HandWritten) {
  for (int i = 0; i < arraysize(tests); i++) {
    for (int j = 0; j < 2; j++) {
      const PrefixTest& t = tests[i];
      string min, max;
      if (j == 0) {
        LOG(INFO) << "Checking regexp=" << CEscape(t.regexp);
        Regexp* re = Regexp::Parse(t.regexp, Regexp::LikePerl, NULL);
        CHECK(re);
        Prog* prog = re->CompileToProg(0);
        CHECK(prog);
        CHECK(prog->PossibleMatchRange(&min, &max, t.maxlen))
          << " " << t.regexp;
        delete prog;
        re->Decref();
      } else {
        CHECK(RE2(t.regexp).PossibleMatchRange(&min, &max, t.maxlen));
      }
      EXPECT_EQ(t.min, min) << t.regexp;
      EXPECT_EQ(t.max, max) << t.regexp;
    }
  }
}